

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 703_kthLargestElement.cpp
# Opt level: O0

int __thiscall KthLargest::add(KthLargest *this,int val)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  int local_14;
  KthLargest *pKStack_10;
  int val_local;
  KthLargest *this_local;
  
  local_14 = val;
  pKStack_10 = this;
  sVar2 = std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::size
                    (&this->pq);
  iVar1 = local_14;
  if (sVar2 < (ulong)(long)this->k) {
    std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::push
              (&this->pq,&local_14);
  }
  else {
    pvVar3 = std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::
             top(&this->pq);
    if (*pvVar3 < iVar1) {
      std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::push
                (&this->pq,&local_14);
      std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::pop
                (&this->pq);
    }
  }
  pvVar3 = std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::top
                     (&this->pq);
  return *pvVar3;
}

Assistant:

int add(int val) {
        if (pq.size()<k)
            pq.push(val);
        else if (val>pq.top())
        {
            pq.push(val);
            pq.pop();
        }
        return pq.top();
    }